

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O0

FlatFilePos __thiscall CBlockIndex::GetUndoPos(CBlockIndex *this)

{
  long lVar1;
  FlatFilePos FVar2;
  char *in_RDI;
  long in_FS_OFFSET;
  FlatFilePos ret;
  FlatFilePos *in_stack_ffffffffffffffd8;
  int local_10;
  uint uStack_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            (in_RDI,in_RDI,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x1109744);
  FlatFilePos::FlatFilePos(in_stack_ffffffffffffffd8);
  if ((*(uint *)(in_RDI + 0x58) & 0x10) != 0) {
    local_10 = *(int *)(in_RDI + 0x1c);
    uStack_c = *(uint *)(in_RDI + 0x24);
  }
  FVar2.nPos = uStack_c;
  FVar2.nFile = local_10;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return FVar2;
  }
  __stack_chk_fail();
}

Assistant:

EXCLUSIVE_LOCKS_REQUIRED(::cs_main)
    {
        AssertLockHeld(::cs_main);
        FlatFilePos ret;
        if (nStatus & BLOCK_HAVE_UNDO) {
            ret.nFile = nFile;
            ret.nPos = nUndoPos;
        }
        return ret;
    }